

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderControlStatementTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Performance::WorkloadReferenceCase::init(WorkloadReferenceCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  value_type *__x;
  bool bVar2;
  char *local_420;
  ostream *local_410;
  Vector<float,_4> local_400;
  Vector<float,_4> local_3f0;
  Vector<float,_4> local_3e0;
  Vector<float,_4> local_3d0;
  AttribSpec local_3c0;
  string local_360 [32];
  string local_340 [32];
  ostream *local_320;
  ostringstream *op;
  undefined1 local_308 [8];
  ostringstream frag;
  ostringstream vtx;
  bool isVertexCase;
  WorkloadReferenceCase *this_local;
  
  bVar2 = (this->super_ControlStatementCase).super_ShaderPerformanceCase.m_caseType !=
          CASETYPE_VERTEX;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
  if (bVar2) {
    local_410 = (ostream *)local_308;
  }
  else {
    local_410 = (ostream *)&frag.field_0x170;
  }
  local_320 = local_410;
  std::operator<<((ostream *)&frag.field_0x170,"attribute highp vec4 a_position;\n");
  std::operator<<((ostream *)&frag.field_0x170,"attribute mediump vec4 a_value;\n");
  if (bVar2) {
    std::operator<<((ostream *)&frag.field_0x170,"varying mediump vec4 v_value;\n");
    std::operator<<((ostream *)local_308,"varying mediump vec4 v_value;\n");
  }
  else {
    std::operator<<((ostream *)&frag.field_0x170,"varying mediump vec4 v_color;\n");
    std::operator<<((ostream *)local_308,"varying mediump vec4 v_color;\n");
  }
  std::operator<<((ostream *)&frag.field_0x170,"\n");
  std::operator<<((ostream *)&frag.field_0x170,"void main()\n");
  std::operator<<((ostream *)&frag.field_0x170,"{\n");
  std::operator<<((ostream *)&frag.field_0x170,"\tgl_Position = a_position;\n");
  std::operator<<((ostream *)local_308,"\n");
  std::operator<<((ostream *)local_308,"void main()\n");
  std::operator<<((ostream *)local_308,"{\n");
  std::operator<<(local_320,"\tmediump vec4 res;\n");
  if (bVar2) {
    local_420 = "v_value";
  }
  else {
    local_420 = "a_value";
  }
  (*(this->super_ControlStatementCase).super_ShaderPerformanceCase.super_TestCase.super_TestNode.
    _vptr_TestNode[8])(this,local_320,"res",local_420);
  if (bVar2) {
    std::operator<<((ostream *)&frag.field_0x170,"\tv_value = a_value;\n");
    std::operator<<((ostream *)local_308,"\tgl_FragColor = res;\n");
  }
  else {
    std::operator<<((ostream *)&frag.field_0x170,"\tv_color = res;\n");
    std::operator<<((ostream *)local_308,"\tgl_FragColor = v_color;\n");
  }
  std::operator<<((ostream *)&frag.field_0x170,"}\n");
  std::operator<<((ostream *)local_308,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=
            ((string *)
             &(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_vertShaderSource,
             local_340);
  std::__cxx11::string::~string(local_340);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=
            ((string *)
             &(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_fragShaderSource,
             local_360);
  std::__cxx11::string::~string(local_360);
  tcu::Vector<float,_4>::Vector(&local_3d0,0.0,0.1,0.2,0.3);
  tcu::Vector<float,_4>::Vector(&local_3e0,0.4,0.5,0.6,0.7);
  tcu::Vector<float,_4>::Vector(&local_3f0,0.8,0.9,1.0,1.1);
  tcu::Vector<float,_4>::Vector(&local_400,1.2,1.3,1.4,1.5);
  deqp::gls::AttribSpec::AttribSpec
            (&local_3c0,"a_value",&local_3d0,&local_3e0,&local_3f0,&local_400);
  __x = &local_3c0;
  std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::push_back
            (&(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_attributes,__x);
  deqp::gls::AttribSpec::~AttribSpec(&local_3c0);
  ControlStatementCase::init(&this->super_ControlStatementCase,(EVP_PKEY_CTX *)__x);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
  iVar1 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag.field_0x170);
  return iVar1;
}

Assistant:

void WorkloadReferenceCase::init (void)
{
	bool isVertexCase = m_caseType == CASETYPE_VERTEX;

	std::ostringstream	vtx;
	std::ostringstream	frag;
	std::ostringstream&	op			= isVertexCase ? vtx : frag;

	vtx << "attribute highp vec4 a_position;\n";	// Position attribute.
	vtx << "attribute mediump vec4 a_value;\n";		// Value for workload calculations.

	// Varyings.
	if (isVertexCase)
	{
		vtx << "varying mediump vec4 v_color;\n";
		frag << "varying mediump vec4 v_color;\n";
	}
	else
	{
		vtx << "varying mediump vec4 v_value;\n";
		frag << "varying mediump vec4 v_value;\n";
	}

	vtx << "\n";
	vtx << "void main()\n";
	vtx << "{\n";
	vtx << "	gl_Position = a_position;\n";

	frag << "\n";
	frag << "void main()\n";
	frag << "{\n";

	op << "\tmediump vec4 res;\n";
	writeWorkload(op, "res", isVertexCase ? "a_value" : "v_value");

	if (isVertexCase)
	{
		// Put result to color variable.
		vtx << "	v_color = res;\n";
		frag << "	gl_FragColor = v_color;\n";
	}
	else
	{
		vtx << "	v_value = a_value;\n";	// Transfer input to fragment shader through varying.
		frag << "	gl_FragColor = res;\n";	// Put result to color variable.
	}

	vtx << "}\n";
	frag << "}\n";

	m_vertShaderSource = vtx.str();
	m_fragShaderSource = frag.str();

	m_attributes.push_back(AttribSpec("a_value",	Vec4(0.0f, 0.1f, 0.2f, 0.3f),
													Vec4(0.4f, 0.5f, 0.6f, 0.7f),
													Vec4(0.8f, 0.9f, 1.0f, 1.1f),
													Vec4(1.2f, 1.3f, 1.4f, 1.5f)));

	ControlStatementCase::init();
}